

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O2

REF_STATUS ref_face_spanning(REF_FACE ref_face,REF_INT node0,REF_INT node1,REF_INT *face)

{
  uint uVar1;
  REF_ADJ pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  REF_INT RVar5;
  ulong uVar6;
  
  *face = -1;
  RVar5 = -1;
  uVar6 = 0xffffffff;
  if (-1 < node0) {
    pRVar2 = ref_face->adj;
    uVar6 = 0xffffffff;
    RVar5 = -1;
    if (node0 < pRVar2->nnode) {
      uVar1 = pRVar2->first[(uint)node0];
      uVar6 = 0xffffffff;
      RVar5 = -1;
      if ((long)(int)uVar1 != -1) {
        RVar5 = pRVar2->item[(int)uVar1].ref;
        uVar6 = (ulong)uVar1;
      }
    }
  }
  while( true ) {
    if ((int)uVar6 == -1) {
      return 5;
    }
    pRVar3 = ref_face->f2n;
    uVar1 = RVar5 * 4;
    if (((((pRVar3[(int)uVar1] == node0) || (pRVar3[(int)(uVar1 | 1)] == node0)) ||
         (pRVar3[(int)(uVar1 | 2)] == node0)) || (pRVar3[(int)(uVar1 | 3)] == node0)) &&
       (((pRVar3[(int)uVar1] == node1 || (pRVar3[(int)(uVar1 | 1)] == node1)) ||
        ((pRVar3[(int)(uVar1 | 2)] == node1 || (pRVar3[(int)(uVar1 | 3)] == node1)))))) break;
    pRVar4 = ref_face->adj->item;
    uVar6 = (ulong)pRVar4[(int)uVar6].next;
    RVar5 = -1;
    if (uVar6 != 0xffffffffffffffff) {
      RVar5 = pRVar4[uVar6].ref;
    }
  }
  *face = RVar5;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_face_spanning(REF_FACE ref_face, REF_INT node0,
                                     REF_INT node1, REF_INT *face) {
  REF_INT item, ref;

  (*face) = REF_EMPTY;

  each_ref_adj_node_item_with_ref(ref_face_adj(ref_face), node0, item, ref) {
    if ((node0 == ref_face_f2n(ref_face, 0, ref) ||
         node0 == ref_face_f2n(ref_face, 1, ref) ||
         node0 == ref_face_f2n(ref_face, 2, ref) ||
         node0 == ref_face_f2n(ref_face, 3, ref)) &&
        (node1 == ref_face_f2n(ref_face, 0, ref) ||
         node1 == ref_face_f2n(ref_face, 1, ref) ||
         node1 == ref_face_f2n(ref_face, 2, ref) ||
         node1 == ref_face_f2n(ref_face, 3, ref))) {
      (*face) = ref;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}